

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_test.cpp
# Opt level: O2

void __thiscall license::test::license_structure::test_method(license_structure *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  allocator local_261;
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  path licLocation;
  allocator local_220 [8];
  undefined8 local_218;
  shared_count sStack_210;
  undefined **local_208;
  ulong local_200;
  shared_count sStack_1f8;
  char *local_1f0;
  string lic_location_str;
  undefined1 local_1c8 [24];
  char *local_1b0;
  _Rb_tree_node_base local_1a8;
  size_t local_188;
  _List_node_base local_180;
  undefined7 local_170;
  undefined4 uStack_169;
  bool local_165;
  int local_164;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  License license;
  
  boost::filesystem::path::path((path *)&license,"test.lic");
  boost::filesystem::operator/(&licLocation,(path *)MyGlobalFixture::licenses_path,(path *)&license)
  ;
  std::__cxx11::string::~string((string *)&license);
  std::__cxx11::string::string((string *)&lic_location_str,(string *)&licLocation);
  License::License(&license,&lic_location_str,(string *)MyGlobalFixture::project_path,false);
  std::__cxx11::string::string((string *)local_1c8,"valid-to",(allocator *)&local_208);
  std::__cxx11::string::string((string *)local_260,"19290111",local_220);
  License::add_parameter(&license,(string *)local_1c8,(string *)local_260);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)local_1c8);
  License::write_license(&license);
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0x46);
  bVar1 = boost::filesystem::exists(&licLocation);
  local_260[0] = bVar1;
  local_260._8_8_ = 0;
  auStack_250._0_8_ = 0;
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_0054cc88;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "license has been created";
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_f0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)auStack_250);
  local_1a8._M_left = &local_1a8;
  local_1a8._M_color = _S_red;
  local_1a8._M_parent = (_Base_ptr)0x0;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = 0;
  local_188 = 0;
  local_180._M_next = &local_180;
  local_170 = 0;
  uStack_169 = 0;
  local_165 = true;
  local_164 = 0;
  local_1a8._M_right = local_1a8._M_left;
  local_180._M_prev = local_180._M_next;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_1c8,
             licLocation.m_pathname._M_dataplus._M_p);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x49);
  iVar2 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
                    ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_1c8,
                     "TEST_PROJECT");
  local_208 = (undefined **)CONCAT71(local_208._1_7_,iVar2 == 3);
  local_200 = 0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_0054ccc8;
  auStack_250._0_8_ = boost::unit_test::lazy_ostream::inst;
  auStack_250._8_8_ = "Section TEST_PROJECT has 3 elements";
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_120 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x4b);
  pcVar3 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                     ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_1c8
                      ,"TEST_PROJECT","valid-to","X",(bool *)0x0);
  std::__cxx11::string::string((string *)local_260,pcVar3,&local_261);
  local_220[0] = (allocator)
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_260,"1929-01-11");
  local_218 = 0;
  sStack_210.pi_ = (sp_counted_base *)0x0;
  local_200 = local_200 & 0xffffffffffffff00;
  local_208 = &PTR__lazy_ostream_0054cd08;
  sStack_1f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1f0 = "Section TEST_PROJECT has expiry date";
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/license_test.cpp"
  ;
  local_150 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_210);
  std::__cxx11::string::~string((string *)local_260);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_1c8);
  License::~License(&license);
  std::__cxx11::string::~string((string *)&lic_location_str);
  std::__cxx11::string::~string((string *)&licLocation);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(license_structure) {
	const fs::path licLocation = MyGlobalFixture::licenses_path / "test.lic";
	const string lic_location_str = licLocation.string();
	License license(&lic_location_str, MyGlobalFixture::project_path.string());
	license.add_parameter(PARAM_EXPIRY_DATE, "19290111");
	license.write_license();

	BOOST_REQUIRE_MESSAGE(fs::exists(licLocation), "license has been created");
	CSimpleIniA ini;
	ini.LoadFile(licLocation.c_str());
	BOOST_CHECK_MESSAGE(ini.GetSectionSize("TEST_PROJECT") == 3, "Section TEST_PROJECT has 3 elements");
	BOOST_CHECK_MESSAGE(string(ini.GetValue("TEST_PROJECT", PARAM_EXPIRY_DATE, "X")) == "1929-01-11",
						"Section TEST_PROJECT has expiry date");
	// std::cout << ini.GetValue("TEST_PROJECT", PARAM_EXPIRY_DATE, "X") << endl;
}